

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplex.cpp
# Opt level: O0

bool isBasisRightSize(HighsLp *lp,SimplexBasis *basis)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  size_type sVar7;
  vector<int,_std::allocator<int>_> *in_RSI;
  int *in_RDI;
  bool right_size;
  
  sVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                    ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 1));
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  sVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                    ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RSI + 2));
  iVar3 = *in_RDI;
  iVar4 = in_RDI[1];
  sVar7 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  return (int)sVar7 == in_RDI[1] && ((int)sVar6 == iVar3 + iVar4 && (int)sVar5 == iVar1 + iVar2);
}

Assistant:

bool isBasisRightSize(const HighsLp& lp, const SimplexBasis& basis) {
  bool right_size = true;
  right_size =
      (HighsInt)basis.nonbasicFlag_.size() == lp.num_col_ + lp.num_row_ &&
      right_size;
  right_size =
      (HighsInt)basis.nonbasicMove_.size() == lp.num_col_ + lp.num_row_ &&
      right_size;
  right_size = (HighsInt)basis.basicIndex_.size() == lp.num_row_ && right_size;
  return right_size;
}